

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O1

void __thiscall LiteScript::Class::Class(Class *this,Class *c)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  
  std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::vector
            (&this->inherit,&c->inherit);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
  ::vector(&this->s_members,&c->s_members);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
  ::vector(&this->us_members,&c->us_members);
  lVar3 = 0;
  do {
    pcVar2 = (this->op_members)._M_elems[0].data + lVar3 + 0x10;
    cVar1 = (c->op_members)._M_elems[0].data[lVar3 + 0x10];
    *pcVar2 = cVar1;
    *(char **)((this->op_members)._M_elems[0].data + lVar3 + 0x18) = pcVar2;
    if (cVar1 == '\0') {
      Variable::Variable((Variable *)((this->op_members)._M_elems[0].data + lVar3),
                         (Variable *)((c->op_members)._M_elems[0].data + lVar3));
    }
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x420);
  this->constructor_index = c->constructor_index;
  this->memory = c->memory;
  lVar3 = 0;
  do {
    (this->op_members)._M_elems[0].data[lVar3 + 0x10] = '\x01';
    *(char **)((this->op_members)._M_elems[0].data + lVar3 + 0x18) =
         (this->op_members)._M_elems[0].data + lVar3 + 0x10;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x420);
  return;
}

Assistant:

LiteScript::Class::Class(const Class &c) :
    inherit(c.inherit), s_members(c.s_members), us_members(c.us_members), op_members(c.op_members),
    memory(c.memory), constructor_index(c.constructor_index)
{
    std::allocator<Nullable<Variable>> allocator;
    for (unsigned int i = 0; i < (unsigned int)OperatorType::OP_TYPE_NUMBER; i++)
        allocator.construct(&this->op_members[i]);
}